

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::serialize
          (StateRecorder *this,uint8_t **serialized_data,size_t *serialized_size)

{
  VkApplicationInfo *info;
  VkPhysicalDeviceFeatures2 *features;
  _Hash_node_base *p_Var1;
  VkRenderPassCreateInfo2 *pass;
  VkGraphicsPipelineCreateInfo *create_info;
  bool bVar2;
  bool bVar3;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  uint8_t *__dest;
  Ch *__src;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *size;
  _Hash_node_base *p_Var4;
  StateRecorder *pSVar5;
  Data *this_00;
  Value render_passes;
  Value value;
  Value render_passes2;
  SubpassMeta subpass_meta;
  Value raytracing_pipelines;
  Value graphics_pipelines;
  Value compute_pipelines;
  Value shader_modules;
  Value pipeline_layouts;
  Value set_layouts;
  Value samplers;
  Value pdf_info;
  Value app_info;
  char *local_1f8;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  StateRecorder *local_1e0;
  Data local_1d8;
  Data local_1c8;
  Data local_1b8;
  long local_1a8;
  long lStack_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined1 local_188 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  char *pcStack_168;
  char *local_160;
  size_t local_158;
  int local_150;
  undefined2 local_14c;
  undefined8 local_148;
  Data local_138;
  Data local_128;
  Data local_118;
  Data local_108;
  Data local_f8;
  Data local_e8;
  Data local_d8;
  Data local_c8;
  Data local_b8;
  size_t *local_a8;
  uint8_t **local_a0;
  Data local_98;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *local_88;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *pMStack_80;
  Stack<rapidjson::CrtAllocator> local_78;
  undefined4 local_48;
  undefined8 local_40;
  
  if (this->impl->database_iface != (DatabaseInterface *)0x0) {
    return false;
  }
  Impl::sync_thread(this->impl);
  local_78.stackEnd_ = (char *)0x0;
  local_78.stack_ = (char *)0x0;
  local_78.stackTop_ = (char *)0x0;
  local_78.allocator_ = (CrtAllocator *)0x0;
  local_78.ownAllocator_ = (CrtAllocator *)0x0;
  local_88 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0;
  pMStack_80 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0;
  local_98.n = (Number)0x0;
  local_98.s.str = (Ch *)0x0;
  local_78.initialCapacity_ = 0x400;
  local_48 = 0;
  local_40 = 0;
  allocator = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)operator_new(0x28);
  allocator->chunkHead_ = (ChunkHeader *)0x0;
  allocator->chunk_capacity_ = 0x10000;
  allocator->userBuffer_ = (void *)0x0;
  allocator->baseAllocator_ = (CrtAllocator *)0x0;
  allocator->ownBaseAllocator_ = (CrtAllocator *)0x0;
  local_98.n = (Number)0x0;
  local_98.s.str = (Ch *)0x3000000000000;
  local_1b8.s.str = (Ch *)0x40500000015277d;
  local_1b8.n = (Number)0x7;
  local_188._0_8_ = (Number)0x6;
  local_188._8_8_ = (Ch *)0x1f6000000000000;
  local_1e0 = this;
  local_88 = allocator;
  pMStack_80 = allocator;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_98.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_1b8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)local_188,allocator);
  pSVar5 = local_1e0;
  local_b8.n = (Number)0x0;
  local_b8.s.str = (Ch *)0x3000000000000;
  local_c8.n = (Number)0x0;
  local_c8.s.str = (Ch *)0x3000000000000;
  local_1d8.n = (Number)0x0;
  local_1d8.s.str = (Ch *)0x0;
  info = local_1e0->impl->application_info;
  if (info != (VkApplicationInfo *)0x0) {
    serialize_application_info_inline<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ((Value *)&local_b8.s,info,allocator);
  }
  features = pSVar5->impl->physical_device_features;
  if ((features == (VkPhysicalDeviceFeatures2 *)0x0) ||
     (bVar2 = serialize_physical_device_features_inline<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((Value *)&local_c8.s,features,allocator), bVar2)) {
    local_188._8_8_ = (Ch *)0x4050000001527af;
    local_188._0_8_ = (Number)0xf;
    local_a8 = serialized_size;
    local_a0 = serialized_data;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_98.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_188,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_b8.s,allocator);
    pSVar5 = local_1e0;
    local_188._8_8_ = (Ch *)0x4050000001527bf;
    local_188._0_8_ = (Number)0x16;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_98.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_188,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_c8.s,allocator);
    local_d8.n.i64 = (Number)0x0;
    local_d8.s.str = (Ch *)0x3000000000000;
    p_Var4 = (pSVar5->impl->samplers)._M_h._M_before_begin._M_nxt;
    if (p_Var4 != (_Hash_node_base *)0x0) {
      do {
        bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          ((VkSamplerCreateInfo *)p_Var4[2]._M_nxt,allocator,(Value *)&local_1d8.s);
        if (!bVar2) goto LAB_0012c0fc;
        uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ((Fossilize *)local_188,(uint64_t)p_Var4[1]._M_nxt,allocator);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_d8.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)local_188,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1d8.s,allocator);
        p_Var4 = p_Var4->_M_nxt;
      } while (p_Var4 != (_Hash_node_base *)0x0);
    }
    local_188._8_8_ = (Ch *)0x4050000001527e9;
    local_188._0_8_ = (Number)0x8;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_98.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_188,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_d8.s,allocator);
    local_e8.n.i64 = (Number)0x0;
    local_e8.s.str = (Ch *)0x3000000000000;
    p_Var4 = (pSVar5->impl->descriptor_sets)._M_h._M_before_begin._M_nxt;
    if (p_Var4 != (_Hash_node_base *)0x0) {
      do {
        bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          ((VkDescriptorSetLayoutCreateInfo *)p_Var4[2]._M_nxt,allocator,
                           (Value *)&local_1d8.s);
        if (!bVar2) goto LAB_0012c0fc;
        uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ((Fossilize *)local_188,(uint64_t)p_Var4[1]._M_nxt,allocator);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_e8.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)local_188,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1d8.s,allocator);
        p_Var4 = p_Var4->_M_nxt;
      } while (p_Var4 != (_Hash_node_base *)0x0);
    }
    local_188._8_8_ = (Ch *)0x405000000151789;
    local_188._0_8_ = (Number)0xa;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_98.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_188,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_e8.s,allocator);
    local_f8.n.i64 = (Number)0x0;
    local_f8.s.str = (Ch *)0x3000000000000;
    p_Var4 = (pSVar5->impl->pipeline_layouts)._M_h._M_before_begin._M_nxt;
    if (p_Var4 != (_Hash_node_base *)0x0) {
      do {
        json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ((VkPipelineLayoutCreateInfo *)p_Var4[2]._M_nxt,allocator,(Value *)&local_1d8.s);
        uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ((Fossilize *)local_188,(uint64_t)p_Var4[1]._M_nxt,allocator);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_f8.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)local_188,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1d8.s,allocator);
        p_Var4 = p_Var4->_M_nxt;
      } while (p_Var4 != (_Hash_node_base *)0x0);
    }
    local_188._8_8_ = (Ch *)0x4050000001527f2;
    local_188._0_8_ = (Number)0xf;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_98.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_188,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_f8.s,allocator);
    local_108.n.i64 = (Number)0x0;
    local_108.s.str = (Ch *)0x3000000000000;
    p_Var4 = (pSVar5->impl->shader_modules)._M_h._M_before_begin._M_nxt;
    if (p_Var4 != (_Hash_node_base *)0x0) {
      do {
        p_Var1 = p_Var4[2]._M_nxt;
        local_1c8.n.i64 = (Number)0x0;
        local_1c8.s.str = (Ch *)0x3000000000000;
        local_1b8._4_1_ = '\0';
        local_1b8._5_1_ = '\0';
        local_1b8._6_1_ = '\0';
        local_1b8._7_1_ = '\0';
        local_1b8._0_4_ = *(uint *)&p_Var1[2]._M_nxt;
        _uStack_1f0 = (Ch *)0x4050000001516e7;
        local_1f8 = (char *)0x5;
        local_1b8.s.str =
             (Ch *)((ulong)(-1 < (int)*(uint *)&p_Var1[2]._M_nxt) << 0x35 | 0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1c8.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1f8,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1b8.s,allocator);
        local_1b8.n.d = (Number)0x1516ed;
        local_1b8._8_4_ = 8;
        size = allocator;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<unsigned_long>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_1c8.s,(StringRefType *)&local_1b8.s,(unsigned_long)p_Var1[3]._M_nxt,
                   allocator);
        local_1f8 = "code";
        uStack_1f0 = 4;
        encode_base64_abi_cxx11_
                  ((string *)local_188,(Fossilize *)p_Var1[4]._M_nxt,p_Var1[3]._M_nxt,(size_t)size);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
        ::AddMember<std::__cxx11::string>
                  ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    *)&local_1c8.s,(StringRefType *)&local_1f8,(string *)local_188,allocator);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._0_8_ != &local_178) {
          operator_delete((void *)local_188._0_8_,local_178._M_allocated_capacity + 1);
        }
        local_1d8.n = local_1c8.n;
        local_1d8.s.str = local_1c8.s.str;
        uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ((Fossilize *)local_188,(uint64_t)p_Var4[1]._M_nxt,allocator);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_108.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)local_188,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1d8.s,allocator);
        p_Var4 = p_Var4->_M_nxt;
      } while (p_Var4 != (_Hash_node_base *)0x0);
    }
    local_188._8_8_ = (Ch *)0x4050000001527db;
    local_188._0_8_ = (Number)0xd;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_98.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_188,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_108.s,allocator);
    local_1f8 = (char *)0x0;
    _uStack_1f0 = (Ch *)0x3000000000000;
    local_1c8.n.i64 = (Number)0x0;
    local_1c8.s.str = (Ch *)0x3000000000000;
    p_Var4 = (local_1e0->impl->render_passes)._M_h._M_before_begin._M_nxt;
    if (p_Var4 != (_Hash_node_base *)0x0) {
      do {
        pass = (VkRenderPassCreateInfo2 *)p_Var4[2]._M_nxt;
        if (pass->sType == VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO) {
          bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                            ((VkRenderPassCreateInfo *)pass,allocator,(Value *)&local_1d8.s);
          if (!bVar2) goto LAB_0012c0fc;
          uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    ((Fossilize *)local_188,(uint64_t)p_Var4[1]._M_nxt,allocator);
          this_00 = (Data *)&local_1f8;
        }
        else {
          if ((pass->sType != VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO_2) ||
             (bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                (pass,allocator,(Value *)&local_1d8.s), !bVar2)) goto LAB_0012c0fc;
          uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    ((Fossilize *)local_188,(uint64_t)p_Var4[1]._M_nxt,allocator);
          this_00 = &local_1c8;
        }
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&this_00->s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)local_188,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1d8.s,allocator);
        p_Var4 = p_Var4->_M_nxt;
      } while (p_Var4 != (_Hash_node_base *)0x0);
    }
    local_188._8_8_ = (Ch *)0x405000000152802;
    local_188._0_8_ = (Number)0xc;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_98.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_188,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_1f8,allocator);
    local_188._8_8_ = (Ch *)0x40500000015280f;
    local_188._0_8_ = (Number)0xd;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_98.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_188,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_1c8.s,allocator);
    pSVar5 = local_1e0;
    local_118.n.i64 = (Number)0x0;
    local_118.s.str = (Ch *)0x3000000000000;
    p_Var4 = (local_1e0->impl->compute_pipelines)._M_h._M_before_begin._M_nxt;
    if (p_Var4 != (_Hash_node_base *)0x0) {
      do {
        bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          ((VkComputePipelineCreateInfo *)p_Var4[2]._M_nxt,allocator,
                           (Value *)&local_1d8.s);
        if (!bVar2) goto LAB_0012c0fc;
        uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ((Fossilize *)local_188,(uint64_t)p_Var4[1]._M_nxt,allocator);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_118.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)local_188,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1d8.s,allocator);
        p_Var4 = p_Var4->_M_nxt;
      } while (p_Var4 != (_Hash_node_base *)0x0);
    }
    local_188._8_8_ = (Ch *)0x40500000015281d;
    local_188._0_8_ = (Number)0x10;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_98.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_188,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_118.s,allocator);
    local_128.n.i64 = (Number)0x0;
    local_128.s.str = (Ch *)0x3000000000000;
    p_Var4 = (pSVar5->impl->graphics_pipelines)._M_h._M_before_begin._M_nxt;
    if (p_Var4 != (_Hash_node_base *)0x0) {
      do {
        local_1b8.n = (Number)((ulong)local_1b8.n & 0xffffffffffff0000);
        create_info = (VkGraphicsPipelineCreateInfo *)p_Var4[2]._M_nxt;
        bVar2 = Impl::get_subpass_meta_for_pipeline
                          (pSVar5->impl,create_info,(Hash)create_info->renderPass,
                           (SubpassMeta *)&local_1b8.s);
        if ((!bVar2) ||
           (bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              (create_info,(SubpassMeta *)&local_1b8.s,allocator,
                               (Value *)&local_1d8.s), !bVar2)) goto LAB_0012c0fc;
        uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ((Fossilize *)local_188,(uint64_t)p_Var4[1]._M_nxt,allocator);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_128.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)local_188,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1d8.s,allocator);
        p_Var4 = p_Var4->_M_nxt;
        pSVar5 = local_1e0;
      } while (p_Var4 != (_Hash_node_base *)0x0);
    }
    local_188._8_8_ = (Ch *)0x40500000015282e;
    local_188._0_8_ = (Number)0x11;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_98.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_188,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_128.s,allocator);
    local_138.n.i64 = (Number)0x0;
    local_138.s.str = (Ch *)0x3000000000000;
    p_Var4 = (pSVar5->impl->raytracing_pipelines)._M_h._M_before_begin._M_nxt;
    bVar2 = p_Var4 == (_Hash_node_base *)0x0;
    if (bVar2) {
LAB_0012c12f:
      local_188._8_8_ = (Ch *)0x405000000152840;
      local_188._0_8_ = (Number)0x13;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_98.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_188,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_138.s,allocator);
      local_198 = 0;
      local_1a8 = 0;
      lStack_1a0 = 0;
      local_1b8.n.i64 = (Number)0x0;
      local_1b8.s.str = (Ch *)0x0;
      local_190 = 0x100;
      local_188._8_8_ = (Ch *)0x0;
      local_178._M_allocated_capacity = 0;
      local_178._8_8_ = 0;
      pcStack_168 = (char *)0x0;
      local_160 = (char *)0x0;
      local_158 = 0x200;
      local_150 = 0x144;
      local_14c._0_1_ = false;
      local_14c._1_1_ = 0x20;
      local_148._0_4_ = 4;
      local_148._4_4_ = kFormatDefault;
      local_188._0_8_ = &local_1b8;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
      Accept<rapidjson::PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>>
                ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  *)&local_98.s,
                 (PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                  *)local_188);
      *local_a8 = lStack_1a0 - local_1a8;
      __dest = (uint8_t *)operator_new__(lStack_1a0 - local_1a8);
      *local_a0 = __dest;
      __src = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              GetString((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                        &local_1b8.s);
      memcpy(__dest,__src,lStack_1a0 - local_1a8);
      rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy
                ((Stack<rapidjson::CrtAllocator> *)(local_188 + 8));
      rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy
                ((Stack<rapidjson::CrtAllocator> *)&local_1b8.s);
    }
    else {
      bVar3 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((VkRayTracingPipelineCreateInfoKHR *)p_Var4[2]._M_nxt,allocator,
                         (Value *)&local_1d8.s);
      if (bVar3) {
        do {
          uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    ((Fossilize *)local_188,(uint64_t)p_Var4[1]._M_nxt,allocator);
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&local_138.s,
                      (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)local_188,
                      (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&local_1d8.s,allocator);
          p_Var4 = p_Var4->_M_nxt;
          bVar2 = p_Var4 == (_Hash_node_base *)0x0;
          if (bVar2) goto LAB_0012c12f;
          bVar3 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                            ((VkRayTracingPipelineCreateInfoKHR *)p_Var4[2]._M_nxt,allocator,
                             (Value *)&local_1d8.s);
        } while (bVar3);
      }
    }
  }
  else {
    bVar2 = false;
  }
LAB_0012c106:
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::Destroy((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             *)&local_98.s);
  rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy(&local_78);
  return bVar2;
LAB_0012c0fc:
  bVar2 = false;
  goto LAB_0012c106;
}

Assistant:

bool StateRecorder::serialize(uint8_t **serialized_data, size_t *serialized_size)
{
	if (impl->database_iface)
		return false;

	impl->sync_thread();

	Document doc;
	doc.SetObject();
	auto &alloc = doc.GetAllocator();

	doc.AddMember("version", FOSSILIZE_FORMAT_VERSION, alloc);

	Value app_info(kObjectType);
	Value pdf_info(kObjectType);
	Value value;

	if (impl->application_info)
		serialize_application_info_inline(app_info, *impl->application_info, alloc);
	if (impl->physical_device_features)
		if (!serialize_physical_device_features_inline(pdf_info, *impl->physical_device_features, alloc))
			return false;

	doc.AddMember("applicationInfo", app_info, alloc);
	doc.AddMember("physicalDeviceFeatures", pdf_info, alloc);

	Value samplers(kObjectType);
	for (auto &sampler : impl->samplers)
	{
		if (!json_value(*sampler.second, alloc, &value))
			return false;
		samplers.AddMember(uint64_string(sampler.first, alloc), value, alloc);
	}
	doc.AddMember("samplers", samplers, alloc);

	Value set_layouts(kObjectType);
	for (auto &layout : impl->descriptor_sets)
	{
		if (!json_value(*layout.second, alloc, &value))
			return false;
		set_layouts.AddMember(uint64_string(layout.first, alloc), value, alloc);
	}
	doc.AddMember("setLayouts", set_layouts, alloc);

	Value pipeline_layouts(kObjectType);
	for (auto &layout : impl->pipeline_layouts)
	{
		if (!json_value(*layout.second, alloc, &value))
			return false;
		pipeline_layouts.AddMember(uint64_string(layout.first, alloc), value, alloc);
	}
	doc.AddMember("pipelineLayouts", pipeline_layouts, alloc);

	Value shader_modules(kObjectType);
	for (auto &module : impl->shader_modules)
	{
		if (!json_value(*module.second, alloc, &value))
			return false;
		shader_modules.AddMember(uint64_string(module.first, alloc), value, alloc);
	}
	doc.AddMember("shaderModules", shader_modules, alloc);

	Value render_passes(kObjectType);
	Value render_passes2(kObjectType);
	for (auto &pass : impl->render_passes)
	{
		switch (static_cast<VkBaseInStructure *>(pass.second)->sType)
		{
		case VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO:
			if (!json_value(*static_cast<VkRenderPassCreateInfo *>(pass.second), alloc, &value))
				return false;
			render_passes.AddMember(uint64_string(pass.first, alloc), value, alloc);
			break;

		case VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO_2:
			if (!json_value(*static_cast<VkRenderPassCreateInfo2 *>(pass.second), alloc, &value))
				return false;
			render_passes2.AddMember(uint64_string(pass.first, alloc), value, alloc);
			break;

		default:
			return false;
		}
	}
	doc.AddMember("renderPasses", render_passes, alloc);
	doc.AddMember("renderPasses2", render_passes2, alloc);

	Value compute_pipelines(kObjectType);
	for (auto &pipe : impl->compute_pipelines)
	{
		if (!json_value(*pipe.second, alloc, &value))
			return false;
		compute_pipelines.AddMember(uint64_string(pipe.first, alloc), value, alloc);
	}
	doc.AddMember("computePipelines", compute_pipelines, alloc);

	Value graphics_pipelines(kObjectType);
	for (auto &pipe : impl->graphics_pipelines)
	{
		SubpassMeta subpass_meta = {};
		if (!impl->get_subpass_meta_for_pipeline(*pipe.second, api_object_cast<Hash>(pipe.second->renderPass),
		                                         &subpass_meta))
			return false;
		if (!json_value(*pipe.second, subpass_meta, alloc, &value))
			return false;
		graphics_pipelines.AddMember(uint64_string(pipe.first, alloc), value, alloc);
	}
	doc.AddMember("graphicsPipelines", graphics_pipelines, alloc);

	Value raytracing_pipelines(kObjectType);
	for (auto &pipe : impl->raytracing_pipelines)
	{
		if (!json_value(*pipe.second, alloc, &value))
			return false;
		raytracing_pipelines.AddMember(uint64_string(pipe.first, alloc), value, alloc);
	}
	doc.AddMember("raytracingPipelines", raytracing_pipelines, alloc);

	StringBuffer buffer;
	PrettyWriter<StringBuffer> writer(buffer);
	doc.Accept(writer);

	*serialized_size = buffer.GetSize();
	*serialized_data = new uint8_t[buffer.GetSize()];
	if (*serialized_data)
	{
		memcpy(*serialized_data, buffer.GetString(), buffer.GetSize());
		return true;
	}
	else
		return false;
}